

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_buffer.cpp
# Opt level: O1

void __thiscall
duckdb::UndoBuffer::Cleanup(UndoBuffer *this,transaction_t lowest_active_transaction)

{
  UndoFlags type;
  UndoFlags UVar1;
  BufferManager *pBVar2;
  UndoFlags *pUVar3;
  IteratorState iterator_state;
  CleanupState state;
  BufferHandle BStack_4108;
  optional_ptr<duckdb::UndoBufferEntry,_true> local_40f0;
  UndoFlags *local_40e8;
  UndoFlags *local_40e0;
  BufferHandle local_40d8;
  CleanupState local_40c0;
  
  CleanupState::CleanupState(&local_40c0,lowest_active_transaction);
  BufferHandle::BufferHandle(&BStack_4108);
  local_40f0.ptr = (this->allocator).tail.ptr;
  if (local_40f0.ptr != (UndoBufferEntry *)0x0) {
    do {
      pBVar2 = (this->allocator).buffer_manager;
      optional_ptr<duckdb::UndoBufferEntry,_true>::CheckValid(&local_40f0);
      (*pBVar2->_vptr_BufferManager[7])(&local_40d8,pBVar2,&(local_40f0.ptr)->block);
      BufferHandle::operator=(&BStack_4108,&local_40d8);
      BufferHandle::~BufferHandle(&local_40d8);
      optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&BStack_4108.node);
      pUVar3 = (UndoFlags *)(BStack_4108.node.ptr)->buffer;
      local_40e8 = pUVar3;
      optional_ptr<duckdb::UndoBufferEntry,_true>::CheckValid(&local_40f0);
      local_40e0 = (UndoFlags *)((long)pUVar3 + (local_40f0.ptr)->position);
      if (local_40e8 < local_40e0) {
        do {
          type = *local_40e8;
          UVar1 = local_40e8[1];
          local_40e8 = local_40e8 + 2;
          CleanupState::CleanupEntry(&local_40c0,type,(data_ptr_t)local_40e8);
          local_40e8 = (UndoFlags *)((ulong)UVar1 + (long)local_40e8);
        } while (local_40e8 < local_40e0);
      }
      optional_ptr<duckdb::UndoBufferEntry,_true>::CheckValid(&local_40f0);
      local_40f0.ptr = ((local_40f0.ptr)->prev).ptr;
    } while (local_40f0.ptr != (UndoBufferEntry *)0x0);
  }
  BufferHandle::~BufferHandle(&BStack_4108);
  CleanupState::~CleanupState(&local_40c0);
  return;
}

Assistant:

void UndoBuffer::Cleanup(transaction_t lowest_active_transaction) {
	// garbage collect everything in the Undo Chunk
	// this should only happen if
	//  (1) the transaction this UndoBuffer belongs to has successfully
	//  committed
	//      (on Rollback the Rollback() function should be called, that clears
	//      the chunks)
	//  (2) there is no active transaction with start_id < commit_id of this
	//  transaction
	CleanupState state(lowest_active_transaction);
	UndoBuffer::IteratorState iterator_state;
	IterateEntries(iterator_state, [&](UndoFlags type, data_ptr_t data) { state.CleanupEntry(type, data); });

#ifdef DEBUG
	// Verify that our index memory is stable.
	for (auto &table : state.indexed_tables) {
		table.second->VerifyIndexBuffers();
	}
#endif
}